

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

int Ivy_ObjIsMuxType(Ivy_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pObj_00;
  bool local_45;
  bool local_2d;
  Ivy_Obj_t *pNode1;
  Ivy_Obj_t *pNode0;
  Ivy_Obj_t *pNode_local;
  
  iVar1 = Ivy_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                  ,0x1e3,"int Ivy_ObjIsMuxType(Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsAnd(pNode);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = Ivy_ObjFaninC0(pNode);
  if ((iVar1 == 0) || (iVar1 = Ivy_ObjFaninC1(pNode), iVar1 == 0)) {
    return 0;
  }
  pObj = Ivy_ObjFanin0(pNode);
  pObj_00 = Ivy_ObjFanin1(pNode);
  iVar1 = Ivy_ObjIsAnd(pObj);
  if ((iVar1 == 0) || (iVar1 = Ivy_ObjIsAnd(pObj_00), iVar1 == 0)) {
    return 0;
  }
  iVar1 = Ivy_ObjFaninId0(pObj);
  iVar2 = Ivy_ObjFaninId0(pObj_00);
  if (iVar1 == iVar2) {
    iVar1 = Ivy_ObjFaninC0(pObj);
    iVar2 = Ivy_ObjFaninC0(pObj_00);
    local_2d = true;
    if (iVar1 != iVar2) goto LAB_00a3945b;
  }
  iVar1 = Ivy_ObjFaninId0(pObj);
  iVar2 = Ivy_ObjFaninId1(pObj_00);
  if (iVar1 == iVar2) {
    iVar1 = Ivy_ObjFaninC0(pObj);
    iVar2 = Ivy_ObjFaninC1(pObj_00);
    local_2d = true;
    if (iVar1 != iVar2) goto LAB_00a3945b;
  }
  iVar1 = Ivy_ObjFaninId1(pObj);
  iVar2 = Ivy_ObjFaninId0(pObj_00);
  if (iVar1 == iVar2) {
    iVar1 = Ivy_ObjFaninC1(pObj);
    iVar2 = Ivy_ObjFaninC0(pObj_00);
    local_2d = true;
    if (iVar1 != iVar2) goto LAB_00a3945b;
  }
  iVar1 = Ivy_ObjFaninId1(pObj);
  iVar2 = Ivy_ObjFaninId1(pObj_00);
  local_45 = false;
  if (iVar1 == iVar2) {
    iVar1 = Ivy_ObjFaninC1(pObj);
    iVar2 = Ivy_ObjFaninC1(pObj_00);
    local_45 = iVar1 != iVar2;
  }
  local_2d = local_45;
LAB_00a3945b:
  return (uint)local_2d;
}

Assistant:

int Ivy_ObjIsMuxType( Ivy_Obj_t * pNode )
{
    Ivy_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Ivy_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Ivy_ObjIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Ivy_ObjFaninC0(pNode) || !Ivy_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Ivy_ObjFanin0(pNode);
    pNode1 = Ivy_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Ivy_ObjIsAnd(pNode0) || !Ivy_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC0(pNode1))) || 
           (Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC1(pNode1))) ||
           (Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC0(pNode1))) ||
           (Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC1(pNode1)));
}